

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

void __thiscall
wasm::UniqueDeferredQueue<wasm::HeapType>::push
          (UniqueDeferredQueue<wasm::HeapType> *this,HeapType item)

{
  mapped_type *pmVar1;
  UniqueDeferredQueue<wasm::HeapType> *this_local;
  HeapType item_local;
  
  this_local = (UniqueDeferredQueue<wasm::HeapType> *)item.id;
  std::queue<wasm::HeapType,_std::deque<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>::push
            (&this->data,(value_type *)&this_local);
  pmVar1 = std::
           unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
           ::operator[](&this->count,(key_type *)&this_local);
  *pmVar1 = *pmVar1 + 1;
  return;
}

Assistant:

void push(T item) {
    data.push(item);
    count[item]++;
  }